

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<float,_4U>::getB10G11R11
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<float,_4U> *this)

{
  float fVar1;
  float fVar2;
  pointer puVar3;
  Color *pCVar4;
  uint uVar5;
  uint32_t y;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint32_t x;
  allocator_type local_31;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,
             (ulong)((this->super_Image).height * (this->super_Image).width * 4),&local_31);
  if ((this->super_Image).height != 0) {
    y = 0;
    do {
      uVar8 = (this->super_Image).width;
      if (uVar8 != 0) {
        x = 0;
        do {
          puVar3 = (__return_storage_ptr__->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pCVar4 = operator()(this,x,y);
          fVar1 = (pCVar4->field_0).comps[0];
          uVar5 = 0;
          if ((fVar1 != 0.0) || (NAN(fVar1))) {
            if (NAN(fVar1)) {
              uVar5 = 0x7ff;
            }
            else {
              uVar5 = 0x7c0;
              if (ABS(fVar1) != INFINITY) {
                uVar5 = (uint)fVar1 >> 0x11 & 0x7ff ^ 0x400;
              }
            }
          }
          fVar1 = (pCVar4->field_0).comps[1];
          fVar2 = (pCVar4->field_0).comps[2];
          uVar7 = 0;
          uVar6 = 0;
          if ((fVar1 != 0.0) || (NAN(fVar1))) {
            if (NAN(fVar1)) {
              uVar6 = 0x3ff800;
            }
            else {
              uVar6 = 0x3e0000;
              if (ABS(fVar1) != INFINITY) {
                uVar6 = (uint)fVar1 >> 6 & 0x3ff800 ^ 0x200000;
              }
            }
          }
          if ((fVar2 != 0.0) || (NAN(fVar2))) {
            if (NAN(fVar2)) {
              uVar7 = 0xffc00000;
            }
            else {
              uVar7 = 0xf8000000;
              if (ABS(fVar2) != INFINITY) {
                uVar7 = ((uint)fVar2 & 0xffc0000) * 0x10 + 0x80000000;
              }
            }
          }
          *(uint *)(puVar3 + (uVar8 * y + x) * 4) = uVar6 | uVar5 | uVar7;
          x = x + 1;
          uVar8 = (this->super_Image).width;
        } while (x < uVar8);
      }
      y = y + 1;
    } while (y < (this->super_Image).height);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<uint8_t> getB10G11R11() const override {
        assert(3 <= componentCount);
        assert(std::is_floating_point_v<componentType>);

        std::vector<uint8_t> data(height * width * 4);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                auto* target = data.data() + (y * width + x) * 4;

                const auto pixel = (*this)(x, y);
                const auto r = pixel[0];
                const auto g = pixel[1];
                const auto b = pixel[2];
                const auto outValue = glm::packF2x11_1x10(glm::vec3(r, g, b));
                std::memcpy(target, &outValue, sizeof(outValue));
            }
        }

        return data;
    }